

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitTrapezoidal.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::integrators::ImplicitTrapezoidal::evaluateCollocationConstraint
          (ImplicitTrapezoidal *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,VectorDynSize *constraintValue)

{
  element_type *peVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ostream *poVar10;
  string *psVar11;
  char *pcVar12;
  pointer pcVar13;
  ostringstream errorMsg;
  long *local_1d8;
  undefined8 local_1d0;
  long local_1c8 [2];
  undefined8 local_1b8;
  undefined8 local_1b0;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
  local_1a8 [16];
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_150;
  double local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_120;
  undefined8 local_118;
  
  if ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    psVar11 = IntegratorInfo::name_abi_cxx11_
                        (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar13 = (psVar11->_M_dataplus)._M_p;
    pcVar12 = "Dynamical system not set.";
LAB_00173e19:
    iDynTree::reportError(pcVar13,"evaluateCollocationConstraint",pcVar12);
  }
  else {
    if ((long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if ((long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x40) {
        sVar3 = iDynTree::VectorDynSize::size();
        sVar4 = DynamicalSystem::stateSpaceSize
                          ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                           super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        if (sVar3 != sVar4) {
          DynamicalSystem::stateSpaceSize
                    ((this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          iDynTree::VectorDynSize::resize((ulong)constraintValue);
        }
        peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                 super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar2 = (*peVar1->_vptr_DynamicalSystem[3])
                          (peVar1,(controlInputs->
                                  super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
        if ((char)iVar2 == '\0') {
LAB_00173ddd:
          psVar11 = IntegratorInfo::name_abi_cxx11_
                              (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar13 = (psVar11->_M_dataplus)._M_p;
          pcVar12 = "Error while setting the control input.";
        }
        else {
          peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar2 = (*peVar1->_vptr_DynamicalSystem[2])
                            (time,peVar1,
                             (collocationPoints->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start,&this->m_computationBuffer);
          if ((char)iVar2 != '\0') {
            peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar2 = (*peVar1->_vptr_DynamicalSystem[3])
                              (peVar1,(controlInputs->
                                      super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 0x20);
            if ((char)iVar2 == '\0') goto LAB_00173ddd;
            peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar2 = (*peVar1->_vptr_DynamicalSystem[2])
                              (time + dT,peVar1,
                               (collocationPoints->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start + 0x20,
                               &this->m_computationBuffer2);
            if ((char)iVar2 != '\0') {
              uVar5 = iDynTree::VectorDynSize::data();
              local_1b0 = iDynTree::VectorDynSize::size();
              local_1b8 = iDynTree::VectorDynSize::data();
              uVar6 = iDynTree::VectorDynSize::size();
              uVar7 = iDynTree::VectorDynSize::data();
              uVar8 = iDynTree::VectorDynSize::size();
              uVar9 = iDynTree::VectorDynSize::data();
              local_150 = iDynTree::VectorDynSize::size();
              local_190 = local_1b0;
              local_178 = local_1b8;
              local_198 = uVar5;
              local_170 = uVar6;
              local_140 = dT * 0.5;
              local_138 = uVar7;
              local_130 = uVar8;
              local_120 = uVar9;
              local_118 = local_150;
              uVar5 = iDynTree::VectorDynSize::data();
              local_1d0 = iDynTree::VectorDynSize::size();
              local_1d8 = (long *)uVar5;
              Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                        ((Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>> *)&local_1d8,
                         local_1a8);
              return true;
            }
          }
          psVar11 = IntegratorInfo::name_abi_cxx11_
                              (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar13 = (psVar11->_M_dataplus)._M_p;
          pcVar12 = "Error while evaluating the dynamical system.";
        }
        goto LAB_00173e19;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The size of the matrix containing the control inputs does not match the expected one. Input = "
                 ,0x5e);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", Expected = 2.",0xf);
      psVar11 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar12 = (psVar11->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError(pcVar12,"evaluateCollocationConstraint",(char *)local_1d8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The size of the matrix containing the collocation point does not match the expected one. Input = "
                 ,0x61);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,", Expected = 2.",0xf);
      psVar11 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar12 = (psVar11->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError(pcVar12,"evaluateCollocationConstraint",(char *)local_1d8);
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)&local_138);
  }
  return false;
}

Assistant:

bool ImplicitTrapezoidal::evaluateCollocationConstraint(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                    const std::vector<VectorDynSize> &controlInputs, double dT,
                                                                    VectorDynSize &constraintValue)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", errorMsg.str().c_str());
                    return false;
                }

                if (constraintValue.size() != m_dynamicalSystem_ptr->stateSpaceSize()) {
                    constraintValue.resize(static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize()));
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamics(collocationPoints[0], time, m_computationBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while evaluating the dynamical system.");
                    return false;
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[1])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamics(collocationPoints[1], time+dT, m_computationBuffer2))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Error while evaluating the dynamical system.");
                    return false;
                }

                toEigen(constraintValue) = -toEigen(collocationPoints[1]) + toEigen(collocationPoints[0]) +
                        dT/2.0*(toEigen(m_computationBuffer)+toEigen(m_computationBuffer2));

                return true;
            }